

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::AsyncCase::fetchLogMessages(AsyncCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  TestError *this_00;
  int msgLen;
  GLint numMsg;
  ScopedLock lock;
  MessageData msg;
  MessageID local_40;
  long lVar3;
  
  iVar2 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  numMsg = 0;
  (**(code **)(lVar3 + 0x868))(0x9145,&numMsg);
  if (0 < numMsg) {
    paVar1 = &msg.message.field_2;
    iVar2 = 0;
    do {
      msgLen = 0;
      msg.id.source = 0;
      msg.id.type = 0;
      msg.id.id = 0;
      msg.severity = 0;
      msg.message._M_string_length = 0;
      msg.message.field_2._M_local_buf[0] = '\0';
      msg.message._M_dataplus._M_p = (pointer)paVar1;
      (**(code **)(lVar3 + 0x868))(0x8243,&msgLen);
      if (msgLen < 0) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Negative message length","msgLen >= 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
                   ,0x650);
LAB_013d0b8c:
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (99999 < msgLen) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Excessively long message","msgLen < 100000",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
                   ,0x651);
        goto LAB_013d0b8c;
      }
      std::__cxx11::string::resize((ulong)&msg.message,(char)msgLen);
      (**(code **)(lVar3 + 0x7e0))
                (1,msgLen,&msg,&msg.id.type,&msg.id.id,&msg.severity,&msgLen,
                 msg.message._M_dataplus._M_p);
      lock.m_mutex = &this->m_mutex;
      deMutex_lock((this->m_mutex).m_mutex);
      local_40.id = msg.id.id;
      local_40.source = msg.id.source;
      local_40.type = msg.id.type;
      pmVar4 = std::
               map<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<std::pair<const_deqp::gles31::Functional::(anonymous_namespace)::MessageID,_deqp::gles31::Functional::(anonymous_namespace)::AsyncCase::MessageCount>_>_>
               ::operator[](&this->m_counts,&local_40);
      pmVar4->received = pmVar4->received + 1;
      deMutex_unlock((lock.m_mutex)->m_mutex);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg.message._M_dataplus._M_p != paVar1) {
        operator_delete(msg.message._M_dataplus._M_p,
                        CONCAT71(msg.message.field_2._M_allocated_capacity._1_7_,
                                 msg.message.field_2._M_local_buf[0]) + 1);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < numMsg);
  }
  return;
}

Assistant:

void AsyncCase::fetchLogMessages (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	GLint					numMsg	= 0;

	gl.getIntegerv(GL_DEBUG_LOGGED_MESSAGES, &numMsg);

	for(int msgNdx = 0; msgNdx < numMsg; msgNdx++)
	{
		int			msgLen = 0;
		MessageData msg;

		gl.getIntegerv(GL_DEBUG_NEXT_LOGGED_MESSAGE_LENGTH, &msgLen);

		TCU_CHECK_MSG(msgLen >= 0, "Negative message length");
		TCU_CHECK_MSG(msgLen < 100000, "Excessively long message");

		msg.message.resize(msgLen);
		gl.getDebugMessageLog(1, msgLen, &msg.id.source, &msg.id.type, &msg.id.id, &msg.severity, &msgLen, &msg.message[0]);

		{
			const de::ScopedLock lock(m_mutex); // Don't block during API call

			m_counts[MessageID(msg.id)].received++;
		}
	}
}